

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_47a96e::StackTest_FindFirst_Test::TestBody(StackTest_FindFirst_Test *this)

{
  bool bVar1;
  int iVar2;
  stack_st_TEST_INT *__p;
  char *pcVar3;
  pointer psVar4;
  TEST_INT *p;
  char *in_R9;
  AssertHelper local_450;
  Message local_448;
  uint local_43c;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_408;
  Message local_400;
  int local_3f4;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_3c0;
  Message local_3b8;
  int local_3ac;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar__10;
  Message local_390;
  uint local_384;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_350;
  Message local_348;
  int local_33c;
  undefined1 local_338 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_308;
  Message local_300;
  int local_2f4;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__8;
  Message local_2d8;
  uint local_2cc;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_298;
  Message local_290;
  int local_284;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_250;
  Message local_248;
  bool local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__6;
  Message local_220;
  uint local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1e0;
  Message local_1d8;
  int local_1cc;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__5;
  size_t index;
  TEST_INT *two;
  AssertHelper local_188;
  Message local_180;
  unique_ptr<int,_bssl::internal::Deleter> local_178;
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_138;
  Message local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__3;
  int local_10c;
  undefined1 local_108 [4];
  int i;
  AssertHelper local_e8;
  Message local_e0;
  unique_ptr<int,_bssl::internal::Deleter> local_d8;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<TEST_INT> value;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<struct_stack_st_TEST_INT> sk;
  StackTest_FindFirst_Test *this_local;
  
  __p = sk_TEST_INT_new(compare);
  std::unique_ptr<stack_st_TEST_INT,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<stack_st_TEST_INT,bssl::internal::Deleter> *)&gtest_ar_.message_,__p);
  testing::AssertionResult::
  AssertionResult<std::unique_ptr<stack_st_TEST_INT,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter> *)&gtest_ar_.message_,
             (type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x890a30,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack_test.cc"
               ,0x143,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    TEST_INT_new((int)&gtest_ar__1 + 8);
    testing::AssertionResult::AssertionResult<std::unique_ptr<int,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,
               (unique_ptr<int,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_88,(AssertionResult *)0x82ff99,
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack_test.cc"
                 ,0x145,pcVar3);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      psVar4 = std::unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter>::get
                         ((unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter> *)
                          &gtest_ar_.message_);
      std::unique_ptr<int,_bssl::internal::Deleter>::unique_ptr
                (&local_d8,(unique_ptr<int,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
      local_c9 = bssl::PushToStack<stack_st_TEST_INT>(psVar4,&local_d8);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_c8,&local_c9,(type *)0x0);
      std::unique_ptr<int,_bssl::internal::Deleter>::~unique_ptr(&local_d8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
      if (!bVar1) {
        testing::Message::Message(&local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_108,(internal *)local_c8,
                   (AssertionResult *)"bssl::PushToStack(sk.get(), std::move(value))","false","true"
                   ,in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack_test.cc"
                   ,0x146,pcVar3);
        testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_e8);
        std::__cxx11::string::~string((string *)local_108);
        testing::Message::~Message(&local_e0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
      if (bVar1) {
        for (local_10c = 0; local_10c < 10; local_10c = local_10c + 1) {
          TEST_INT_new((int)&gtest_ar__3 + 8);
          std::unique_ptr<int,_bssl::internal::Deleter>::operator=
                    ((unique_ptr<int,_bssl::internal::Deleter> *)&gtest_ar__1.message_,
                     (unique_ptr<int,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
          std::unique_ptr<int,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<int,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
          testing::AssertionResult::AssertionResult<std::unique_ptr<int,bssl::internal::Deleter>>
                    ((AssertionResult *)local_128,
                     (unique_ptr<int,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
          if (!bVar1) {
            testing::Message::Message(&local_130);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__4.message_,(internal *)local_128,
                       (AssertionResult *)0x82ff99,"false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_138,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack_test.cc"
                       ,0x149,pcVar3);
            testing::internal::AssertHelper::operator=(&local_138,&local_130);
            testing::internal::AssertHelper::~AssertHelper(&local_138);
            std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
            testing::Message::~Message(&local_130);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
          if (!bVar1) goto LAB_0054bbae;
          psVar4 = std::unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter>::get
                             ((unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter> *)
                              &gtest_ar_.message_);
          std::unique_ptr<int,_bssl::internal::Deleter>::unique_ptr
                    (&local_178,(unique_ptr<int,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
          local_169 = bssl::PushToStack<stack_st_TEST_INT>(psVar4,&local_178);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_168,&local_169,(type *)0x0);
          std::unique_ptr<int,_bssl::internal::Deleter>::~unique_ptr(&local_178);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
          if (!bVar1) {
            testing::Message::Message(&local_180);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&two,(internal *)local_168,
                       (AssertionResult *)"bssl::PushToStack(sk.get(), std::move(value))","false",
                       "true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_188,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack_test.cc"
                       ,0x14a,pcVar3);
            testing::internal::AssertHelper::operator=(&local_188,&local_180);
            testing::internal::AssertHelper::~AssertHelper(&local_188);
            std::__cxx11::string::~string((string *)&two);
            testing::Message::~Message(&local_180);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
          if (!bVar1) goto LAB_0054bbae;
        }
        psVar4 = std::unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter>::get
                           ((unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter> *)
                            &gtest_ar_.message_);
        p = sk_TEST_INT_value(psVar4,1);
        psVar4 = std::unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter>::get
                           ((unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter> *)
                            &gtest_ar_.message_);
        local_1cc = sk_TEST_INT_find(psVar4,(size_t *)&gtest_ar__5.message_,p);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_1c8,&local_1cc,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
        if (!bVar1) {
          testing::Message::Message(&local_1d8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar.message_,(internal *)local_1c8,
                     (AssertionResult *)"sk_TEST_INT_find(sk.get(), &index, two)","false","true",
                     in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1e0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack_test.cc"
                     ,0x150,pcVar3);
          testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
          testing::internal::AssertHelper::~AssertHelper(&local_1e0);
          std::__cxx11::string::~string((string *)&gtest_ar.message_);
          testing::Message::~Message(&local_1d8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
        if (bVar1) {
          local_214 = 1;
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                    ((EqHelper *)local_210,"1u","index",&local_214,
                     (unsigned_long *)&gtest_ar__5.message_);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
          if (!bVar1) {
            testing::Message::Message(&local_220);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__6.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack_test.cc"
                       ,0x151,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__6.message_,&local_220);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6.message_);
            testing::Message::~Message(&local_220);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
          psVar4 = std::unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter>::get
                             ((unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter> *)
                              &gtest_ar_.message_);
          sk_TEST_INT_set_cmp_func(psVar4,compare);
          psVar4 = std::unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter>::get
                             ((unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter> *)
                              &gtest_ar_.message_);
          iVar2 = sk_TEST_INT_is_sorted(psVar4);
          local_239 = iVar2 == 0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_238,&local_239,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
          if (!bVar1) {
            testing::Message::Message(&local_248);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__7.message_,(internal *)local_238,
                       (AssertionResult *)"sk_TEST_INT_is_sorted(sk.get())","true","false",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_250,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack_test.cc"
                       ,0x155,pcVar3);
            testing::internal::AssertHelper::operator=(&local_250,&local_248);
            testing::internal::AssertHelper::~AssertHelper(&local_250);
            std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
            testing::Message::~Message(&local_248);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
          psVar4 = std::unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter>::get
                             ((unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter> *)
                              &gtest_ar_.message_);
          local_284 = sk_TEST_INT_find(psVar4,(size_t *)&gtest_ar__5.message_,p);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_280,&local_284,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
          if (!bVar1) {
            testing::Message::Message(&local_290);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_1.message_,(internal *)local_280,
                       (AssertionResult *)"sk_TEST_INT_find(sk.get(), &index, two)","false","true",
                       in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_298,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack_test.cc"
                       ,0x156,pcVar3);
            testing::internal::AssertHelper::operator=(&local_298,&local_290);
            testing::internal::AssertHelper::~AssertHelper(&local_298);
            std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
            testing::Message::~Message(&local_290);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
          if (bVar1) {
            local_2cc = 1;
            testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                      ((EqHelper *)local_2c8,"1u","index",&local_2cc,
                       (unsigned_long *)&gtest_ar__5.message_);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
            if (!bVar1) {
              testing::Message::Message(&local_2d8);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__8.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack_test.cc"
                         ,0x157,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__8.message_,&local_2d8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__8.message_);
              testing::Message::~Message(&local_2d8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
            psVar4 = std::unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter>::get
                               ((unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            sk_TEST_INT_sort(psVar4);
            psVar4 = std::unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter>::get
                               ((unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            local_2f4 = sk_TEST_INT_is_sorted(psVar4);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_2f0,&local_2f4,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
            if (!bVar1) {
              testing::Message::Message(&local_300);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__9.message_,(internal *)local_2f0,
                         (AssertionResult *)"sk_TEST_INT_is_sorted(sk.get())","false","true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_308,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack_test.cc"
                         ,0x15b,pcVar3);
              testing::internal::AssertHelper::operator=(&local_308,&local_300);
              testing::internal::AssertHelper::~AssertHelper(&local_308);
              std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
              testing::Message::~Message(&local_300);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
            psVar4 = std::unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter>::get
                               ((unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            local_33c = sk_TEST_INT_find(psVar4,(size_t *)&gtest_ar__5.message_,p);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_338,&local_33c,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
            if (!bVar1) {
              testing::Message::Message(&local_348);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_2.message_,(internal *)local_338,
                         (AssertionResult *)"sk_TEST_INT_find(sk.get(), &index, two)","false","true"
                         ,in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_350,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack_test.cc"
                         ,0x15c,pcVar3);
              testing::internal::AssertHelper::operator=(&local_350,&local_348);
              testing::internal::AssertHelper::~AssertHelper(&local_350);
              std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
              testing::Message::~Message(&local_348);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
            if (bVar1) {
              local_384 = 1;
              testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                        ((EqHelper *)local_380,"1u","index",&local_384,
                         (unsigned_long *)&gtest_ar__5.message_);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
              if (!bVar1) {
                testing::Message::Message(&local_390);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__10.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack_test.cc"
                           ,0x15d,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__10.message_,&local_390);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__10.message_);
                testing::Message::~Message(&local_390);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
              psVar4 = std::unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter>::get
                                 ((unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              sk_TEST_INT_set_cmp_func(psVar4,compare_reverse);
              psVar4 = std::unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter>::get
                                 ((unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              sk_TEST_INT_sort(psVar4);
              psVar4 = std::unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter>::get
                                 ((unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              local_3ac = sk_TEST_INT_is_sorted(psVar4);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_3a8,&local_3ac,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
              if (!bVar1) {
                testing::Message::Message(&local_3b8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__11.message_,(internal *)local_3a8,
                           (AssertionResult *)"sk_TEST_INT_is_sorted(sk.get())","false","true",in_R9
                          );
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_3c0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack_test.cc"
                           ,0x162,pcVar3);
                testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
                testing::internal::AssertHelper::~AssertHelper(&local_3c0);
                std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
                testing::Message::~Message(&local_3b8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
              psVar4 = std::unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter>::get
                                 ((unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              local_3f4 = sk_TEST_INT_find(psVar4,(size_t *)&gtest_ar__5.message_,p);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_3f0,&local_3f4,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
              if (!bVar1) {
                testing::Message::Message(&local_400);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_3.message_,(internal *)local_3f0,
                           (AssertionResult *)"sk_TEST_INT_find(sk.get(), &index, two)","false",
                           "true",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_408,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack_test.cc"
                           ,0x163,pcVar3);
                testing::internal::AssertHelper::operator=(&local_408,&local_400);
                testing::internal::AssertHelper::~AssertHelper(&local_408);
                std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
                testing::Message::~Message(&local_400);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
              if (bVar1) {
                local_43c = 0;
                testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                          ((EqHelper *)local_438,"0u","index",&local_43c,
                           (unsigned_long *)&gtest_ar__5.message_);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_438);
                if (!bVar1) {
                  testing::Message::Message(&local_448);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_450,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack_test.cc"
                             ,0x164,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_450,&local_448);
                  testing::internal::AssertHelper::~AssertHelper(&local_450);
                  testing::Message::~Message(&local_448);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
              }
            }
          }
        }
      }
    }
LAB_0054bbae:
    std::unique_ptr<int,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<int,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_TEST_INT,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(StackTest, FindFirst) {
  bssl::UniquePtr<STACK_OF(TEST_INT)> sk(sk_TEST_INT_new(compare));
  ASSERT_TRUE(sk);
  auto value = TEST_INT_new(1);
  ASSERT_TRUE(value);
  ASSERT_TRUE(bssl::PushToStack(sk.get(), std::move(value)));
  for (int i = 0; i < 10; i++) {
    value = TEST_INT_new(2);
    ASSERT_TRUE(value);
    ASSERT_TRUE(bssl::PushToStack(sk.get(), std::move(value)));
  }

  const TEST_INT *two = sk_TEST_INT_value(sk.get(), 1);
  // Pointer-based equality.
  size_t index;
  ASSERT_TRUE(sk_TEST_INT_find(sk.get(), &index, two));
  EXPECT_EQ(1u, index);

  // Comparator-based equality, unsorted.
  sk_TEST_INT_set_cmp_func(sk.get(), compare);
  EXPECT_FALSE(sk_TEST_INT_is_sorted(sk.get()));
  ASSERT_TRUE(sk_TEST_INT_find(sk.get(), &index, two));
  EXPECT_EQ(1u, index);

  // Comparator-based equality, sorted.
  sk_TEST_INT_sort(sk.get());
  EXPECT_TRUE(sk_TEST_INT_is_sorted(sk.get()));
  ASSERT_TRUE(sk_TEST_INT_find(sk.get(), &index, two));
  EXPECT_EQ(1u, index);

  // Comparator-based equality, sorted and at the front.
  sk_TEST_INT_set_cmp_func(sk.get(), compare_reverse);
  sk_TEST_INT_sort(sk.get());
  EXPECT_TRUE(sk_TEST_INT_is_sorted(sk.get()));
  ASSERT_TRUE(sk_TEST_INT_find(sk.get(), &index, two));
  EXPECT_EQ(0u, index);
}